

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int bn_cmp_part_words(unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  unsigned_long *in_RSI;
  unsigned_long *in_RDI;
  int i;
  int n;
  int local_28;
  
  local_28 = in_ECX;
  if (in_ECX < 0) {
    for (; local_28 < 0; local_28 = local_28 + 1) {
      if (in_RSI[(in_EDX + -1) - local_28] != 0) {
        return -1;
      }
    }
  }
  local_28 = in_ECX;
  if (0 < in_ECX) {
    for (; 0 < local_28; local_28 = local_28 + -1) {
      if (in_RDI[in_EDX + -1 + local_28] != 0) {
        return 1;
      }
    }
  }
  iVar1 = bn_cmp_words(in_RDI,in_RSI,in_EDX);
  return iVar1;
}

Assistant:

int bn_cmp_part_words(const BN_ULONG *a, const BN_ULONG *b, int cl, int dl)
{
    int n, i;
    n = cl - 1;

    if (dl < 0) {
        for (i = dl; i < 0; i++) {
            if (b[n - i] != 0)
                return -1;      /* a < b */
        }
    }
    if (dl > 0) {
        for (i = dl; i > 0; i--) {
            if (a[n + i] != 0)
                return 1;       /* a > b */
        }
    }
    return bn_cmp_words(a, b, cl);
}